

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O1

Vec_Int_t * Wlc_NtkCollectMemFanins(Wlc_Ntk_t *p,Vec_Int_t *vMemObjs)

{
  Wlc_Obj_t *pWVar1;
  int iVar2;
  Vec_Int_t *p_00;
  int *piVar3;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar3 = (int *)malloc(400);
  p_00->pArray = piVar3;
  if (0 < vMemObjs->nSize) {
    lVar7 = 0;
    do {
      iVar2 = vMemObjs->pArray[lVar7];
      if (((long)iVar2 < 1) || (p->nObjsAlloc <= iVar2)) {
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      pWVar1 = p->pObjs + iVar2;
      uVar6 = *(ushort *)pWVar1 & 0x3f;
      if (uVar6 - 0x36 < 2) {
        uVar5 = (ulong)pWVar1->nFanins;
        if (0 < (int)pWVar1->nFanins) {
          lVar8 = 0;
          do {
            if ((2 < (uint)uVar5) ||
               (paVar4 = &pWVar1->field_10,
               (undefined1  [24])((undefined1  [24])*pWVar1 & (undefined1  [24])0x2f) ==
               (undefined1  [24])0x6)) {
              paVar4 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWVar1->field_10).pFanins[0];
            }
            if (lVar8 != 0) {
              Vec_IntPush(p_00,paVar4->Fanins[lVar8]);
            }
            lVar8 = lVar8 + 1;
            uVar5 = (ulong)(int)pWVar1->nFanins;
          } while (lVar8 < (long)uVar5);
        }
      }
      else if (uVar6 == 8) {
        paVar4 = &pWVar1->field_10;
        if (((*(ushort *)pWVar1 & 0x2f) == 6) || (2 < pWVar1->nFanins)) {
          paVar4 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar4->pFanins[0];
        }
        Vec_IntPush(p_00,paVar4->Fanins[0]);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < vMemObjs->nSize);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Wlc_NtkCollectMemFanins( Wlc_Ntk_t * p, Vec_Int_t * vMemObjs )
{
    Wlc_Obj_t * pObj; int i, k, iFanin;
    Vec_Int_t * vMemFanins = Vec_IntAlloc( 100 );
    Wlc_NtkForEachObjVec( vMemObjs, p, pObj, i )
    {
        if ( Wlc_ObjType(pObj) == WLC_OBJ_MUX )
            Vec_IntPush( vMemFanins, Wlc_ObjFaninId0(pObj) );
        else if ( Wlc_ObjType(pObj) == WLC_OBJ_READ || Wlc_ObjType(pObj) == WLC_OBJ_WRITE )
        {
            Wlc_ObjForEachFanin( pObj, iFanin, k )
                if ( k > 0 )
                    Vec_IntPush( vMemFanins, iFanin );
        }
    }
    return vMemFanins;
}